

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
          (Memory *this,u32 offset,u32 addend,uchar rhs,
          BinopFunc<unsigned_char,_unsigned_char> **func,uchar *out)

{
  uchar uVar1;
  pointer puVar2;
  uchar uVar3;
  Enum EVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)offset;
  uVar5 = (ulong)addend;
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  EVar4 = Error;
  if (uVar5 + uVar6 <
      (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    uVar1 = puVar2[uVar5 + uVar6];
    uVar3 = (**func)(uVar1,rhs);
    puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (uVar5 + uVar6 <
        (ulong)((long)(this->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2)) {
      puVar2[uVar5 + uVar6] = uVar3;
      *out = uVar1;
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

inline bool Memory::IsValidAccess(u32 offset, u32 addend, size_t size) const {
  return u64{offset} + addend + size <= data_.size();
}